

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraHot.c
# Opt level: O3

Aig_Man_t * Fra_OneHotCreateExdc(Fra_Man_t *p,Vec_Int_t *vOneHots)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  void **ppvVar4;
  int iVar5;
  uint uVar6;
  Aig_Man_t *p_00;
  Aig_Obj_t *pDriver;
  uint uVar7;
  Aig_Man_t *pAVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  
  p_00 = Aig_ManStart(vOneHots->nSize / 2);
  pAVar8 = p->pManAig;
  if (0 < pAVar8->vCis->nSize) {
    iVar9 = 0;
    do {
      Aig_ObjCreateCi(p_00);
      iVar9 = iVar9 + 1;
      pAVar8 = p->pManAig;
    } while (iVar9 < pAVar8->vCis->nSize);
  }
  iVar9 = vOneHots->nSize;
  if (0 < iVar9) {
    iVar10 = pAVar8->nObjs[2] - pAVar8->nRegs;
    lVar11 = 1;
    do {
      if (iVar9 <= lVar11) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar1 = vOneHots->pArray[lVar11 + -1];
      uVar2 = vOneHots->pArray[lVar11];
      if (uVar1 != 0 || uVar2 != 0) {
        uVar6 = ~uVar1;
        if (0 < (int)uVar1) {
          uVar6 = uVar1 - 1;
        }
        uVar6 = uVar6 + iVar10;
        if ((int)uVar6 < 0) {
LAB_009102f1:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        uVar3 = p_00->vCis->nSize;
        if ((int)uVar3 <= (int)uVar6) goto LAB_009102f1;
        uVar7 = ~uVar2;
        if (0 < (int)uVar2) {
          uVar7 = uVar2 - 1;
        }
        uVar7 = uVar7 + iVar10;
        if (((int)uVar7 < 0) || (uVar3 <= uVar7)) goto LAB_009102f1;
        ppvVar4 = p_00->vCis->pArray;
        pDriver = Aig_Or(p_00,(Aig_Obj_t *)((ulong)(uVar1 >> 0x1f) ^ (ulong)ppvVar4[uVar6]),
                         (Aig_Obj_t *)((ulong)(uVar2 >> 0x1f) ^ (ulong)ppvVar4[uVar7]));
        Aig_ObjCreateCo(p_00,pDriver);
        iVar9 = vOneHots->nSize;
      }
      iVar5 = (int)lVar11;
      lVar11 = lVar11 + 2;
    } while (iVar5 + 1 < iVar9);
  }
  Aig_ManCleanup(p_00);
  return p_00;
}

Assistant:

Aig_Man_t * Fra_OneHotCreateExdc( Fra_Man_t * p, Vec_Int_t * vOneHots )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj1, * pObj2, * pObj;
    int i, Out1, Out2, nTruePis;
    pNew = Aig_ManStart( Vec_IntSize(vOneHots)/2 );
//    for ( i = 0; i < Aig_ManRegNum(p->pManAig); i++ )
//        Aig_ObjCreateCi(pNew);
    Aig_ManForEachCi( p->pManAig, pObj, i )
        Aig_ObjCreateCi(pNew);
    nTruePis = Aig_ManCiNum(p->pManAig) - Aig_ManRegNum(p->pManAig);
    for ( i = 0; i < Vec_IntSize(vOneHots); i += 2 )
    {
        Out1 = Vec_IntEntry( vOneHots, i );
        Out2 = Vec_IntEntry( vOneHots, i+1 );
        if ( Out1 == 0 && Out2 == 0 )
            continue;
        pObj1 = Aig_ManCi( pNew, nTruePis + Fra_LitReg(Out1) );
        pObj2 = Aig_ManCi( pNew, nTruePis + Fra_LitReg(Out2) );
        pObj1 = Aig_NotCond( pObj1, Fra_LitSign(Out1) );
        pObj2 = Aig_NotCond( pObj2, Fra_LitSign(Out2) );
        pObj  = Aig_Or( pNew, pObj1, pObj2 );
        Aig_ObjCreateCo( pNew, pObj );
    }
    Aig_ManCleanup(pNew);
//    printf( "Created AIG with %d nodes and %d outputs.\n", Aig_ManNodeNum(pNew), Aig_ManCoNum(pNew) );
    return pNew;
}